

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall
TempTrackerBase::TempTrackerBase(TempTrackerBase *this,JitArenaAllocator *alloc,bool inLoop)

{
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar1;
  undefined3 in_register_00000011;
  
  (this->nonTempSyms).head = (Type_conflict)0x0;
  (this->nonTempSyms).lastFoundIndex = (Type_conflict)0x0;
  (this->nonTempSyms).alloc = alloc;
  (this->nonTempSyms).lastUsedNodePrevNextField = (Type)this;
  (this->tempTransferredSyms).head = (Type_conflict)0x0;
  (this->tempTransferredSyms).lastFoundIndex = (Type_conflict)0x0;
  (this->tempTransferredSyms).alloc = alloc;
  (this->tempTransferredSyms).lastUsedNodePrevNextField = &(this->tempTransferredSyms).head;
  if (CONCAT31(in_register_00000011,inLoop) == 0) {
    pHVar1 = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  else {
    pHVar1 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                       (&alloc->super_ArenaAllocator,0x10);
  }
  this->tempTransferDependencies = pHVar1;
  return;
}

Assistant:

TempTrackerBase::TempTrackerBase(JitArenaAllocator * alloc, bool inLoop)
    : nonTempSyms(alloc), tempTransferredSyms(alloc)
{
    if (inLoop)
    {
        tempTransferDependencies = HashTable<BVSparse<JitArenaAllocator> *>::New(alloc, 16);
    }
    else
    {
        tempTransferDependencies = nullptr;
    }
}